

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O0

bool read_int8scale_table
               (char *filepath,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
               *blob_int8scale_table,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
               *weight_int8scale_table)

{
  int iVar1;
  char *pcVar2;
  size_type sVar3;
  size_t __n;
  reference pvVar4;
  float *pfVar5;
  char *in_RDI;
  void *pvVar6;
  bool is_key;
  char key [256];
  float scale;
  char *s;
  size_t len;
  char *pch;
  vector<char,_std::allocator<char>_> line;
  vector<float,_std::allocator<float>_> scales;
  string key_str;
  FILE *fp;
  mapped_type *in_stack_fffffffffffffcc0;
  Mat *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd4;
  size_type in_stack_fffffffffffffcd8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  key_type *in_stack_fffffffffffffcf8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *this;
  Mat local_2e0;
  Mat local_298;
  Mat local_250;
  Mat local_208;
  byte local_1b9;
  key_type local_1b8 [8];
  undefined4 local_ac;
  char *local_a8;
  undefined8 local_a0;
  char *local_98;
  allocator<char> local_79;
  undefined1 local_78 [24];
  undefined1 local_60 [56];
  FILE *local_28;
  char *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
           *)0x15620c);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
           *)0x156219);
  local_28 = fopen(local_10,"rb");
  if (local_28 == (FILE *)0x0) {
    fprintf(_stderr,"Open %s failed.\n",local_10);
    local_1 = 0;
  }
  else {
    std::__cxx11::string::string((string *)(local_60 + 0x18));
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x156287);
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    std::allocator<char>::~allocator(&local_79);
    local_98 = (char *)0x0;
    local_a0 = 0;
    while (iVar1 = feof(local_28), iVar1 == 0) {
      this = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
              *)local_78;
      pcVar2 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x156307);
      sVar3 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)this);
      local_a8 = fgets(pcVar2,(int)sVar3,local_28);
      if (local_a8 == (char *)0x0) break;
      local_ac = 0x3f800000;
      pcVar2 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x1563ab);
      __n = strcspn(pcVar2,"\r\n");
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_78,__n);
      *pvVar4 = '\0';
      pcVar2 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x1563da);
      local_98 = strtok(pcVar2," ");
      if (local_98 == (char *)0x0) break;
      local_1b9 = 1;
      while (local_98 != (char *)0x0) {
        if ((local_1b9 & 1) == 0) {
          __isoc99_sscanf(local_98,"%f");
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                     (value_type_conflict1 *)in_stack_fffffffffffffcc8);
        }
        else {
          in_stack_fffffffffffffcf8 = local_1b8;
          __isoc99_sscanf(local_98,"%255s");
          std::__cxx11::string::operator=
                    ((string *)(local_60 + 0x18),(char *)in_stack_fffffffffffffcf8);
          local_1b9 = 0;
        }
        local_98 = strtok((char *)0x0," ");
      }
      pcVar2 = (char *)std::__cxx11::string::c_str();
      pcVar2 = strstr(pcVar2,"_param_");
      if (pcVar2 == (char *)0x0) {
        in_stack_fffffffffffffcc8 = (Mat *)local_60;
        sVar3 = std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcc8);
        in_stack_fffffffffffffcd4 = (int)sVar3;
        pfVar5 = std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)0x1565f2);
        pvVar6 = (void *)0x0;
        iVar1 = 4;
        ncnn::Mat::Mat(&local_2e0,in_stack_fffffffffffffcd4,pfVar5,4,(Allocator *)0x0);
        ncnn::Mat::clone(&local_298,(__fn *)&local_2e0,(void *)0x0,iVar1,pvVar6);
        in_stack_fffffffffffffcc0 =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
             ::operator[](this,in_stack_fffffffffffffcf8);
        ncnn::Mat::operator=(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
        ncnn::Mat::~Mat((Mat *)0x156664);
        ncnn::Mat::~Mat((Mat *)0x15666e);
      }
      else {
        sVar3 = std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)local_60);
        pfVar5 = std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)0x1564ff);
        pvVar6 = (void *)0x0;
        iVar1 = 4;
        ncnn::Mat::Mat(&local_250,(int)sVar3,pfVar5,4,(Allocator *)0x0);
        ncnn::Mat::clone(&local_208,(__fn *)&local_250,(void *)0x0,iVar1,pvVar6);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
        ::operator[](this,in_stack_fffffffffffffcf8);
        ncnn::Mat::operator=(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
        ncnn::Mat::~Mat((Mat *)0x156577);
        ncnn::Mat::~Mat((Mat *)0x156584);
      }
      std::__cxx11::string::clear();
      std::vector<float,_std::allocator<float>_>::clear
                ((vector<float,_std::allocator<float>_> *)0x1566cd);
    }
    fclose(local_28);
    local_1 = 1;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    std::__cxx11::string::~string((string *)(local_60 + 0x18));
  }
  return (bool)(local_1 & 1);
}

Assistant:

static bool read_int8scale_table(const char* filepath, std::map<std::string, ncnn::Mat>& blob_int8scale_table, std::map<std::string, ncnn::Mat>& weight_int8scale_table)
{
    blob_int8scale_table.clear();
    weight_int8scale_table.clear();

    FILE* fp = fopen(filepath, "rb");
    if (!fp)
    {
        fprintf(stderr, "Open %s failed.\n", filepath);
        return false;
    }

    std::string key_str;
    std::vector<float> scales;

    std::vector<char> line(10240000);
    char* pch = NULL;
    size_t len = 0;

    while (!feof(fp))
    {
        char* s = fgets(line.data(), (int)line.size(), fp);
        if (!s)
            break;

        float scale = 1.f;
        char key[256];
        line[strcspn(line.data(), "\r\n")] = 0;

        pch = strtok(line.data(), " ");

        if (pch == NULL) break;

        bool is_key = true;
        while (pch != NULL)
        {
            if (is_key)
            {
                sscanf(pch, "%255s", key);

                key_str = key;
                is_key = false;
            }
            else
            {
                sscanf(pch, "%f", &scale);

                scales.push_back(scale);
            }

            pch = strtok(NULL, " ");
        }

        // XYZ_param_N pattern
        if (strstr(key_str.c_str(), "_param_"))
        {
            weight_int8scale_table[key_str] = ncnn::Mat((int)scales.size(), (void*)scales.data()).clone();
        }
        else
        {
            blob_int8scale_table[key_str] = ncnn::Mat((int)scales.size(), (void*)scales.data()).clone();
        }
        key_str.clear();
        scales.clear();
    }

    fclose(fp);

    return true;
}